

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getEQICmp
          (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join)

{
  pointer ppVVar1;
  VRAssumeBool *assume;
  pointer ppIVar2;
  pointer ppIVar3;
  Relation RVar4;
  const_iterator __begin3;
  pointer ppIVar5;
  pointer ppVVar6;
  ICmpInst *icmp;
  undefined8 local_78;
  iterator iStack_70;
  pointer local_68;
  ICmpInst *local_58;
  RelationsAnalyzer *local_50;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> local_48;
  
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  iStack_70._M_current._0_4_ = 0;
  iStack_70._M_current._4_4_ = 0;
  local_78 = (void *)0x0;
  iStack_70._M_current = (ICmpInst **)0x0;
  local_68 = (pointer)0x0;
  ppVVar6 = (join->loopEnds).
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (join->loopEnds).
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_50 = this;
  if (ppVVar6 == ppVVar1) {
    local_68 = (pointer)0x0;
  }
  else {
    do {
      assume = (VRAssumeBool *)
               ((*ppVVar6)->op)._M_t.
               super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>._M_t.
               super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
               super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl;
      if (*(VROpType *)((long)&assume->super_VRAssume + 8) == ASSUME_BOOL) {
        StructureAnalyzer::getRelevantConditions
                  (&local_48,*(StructureAnalyzer **)(local_50 + 0x40),assume);
        ppIVar3 = local_48.
                  super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppIVar2 = local_48.
                  super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppIVar5 = local_48.
                  super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_48.
            super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_48.
            super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        else {
          do {
            local_58 = *ppIVar5;
            RVar4 = ICMPToRel(local_58,assume->assumption);
            if (RVar4 == EQ) {
              if (iStack_70._M_current == local_68) {
                std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
                _M_realloc_insert<llvm::ICmpInst_const*&>
                          ((vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>> *)
                           &local_78,iStack_70,&local_58);
              }
              else {
                *iStack_70._M_current = local_58;
                iStack_70._M_current = iStack_70._M_current + 1;
              }
            }
            ppIVar5 = ppIVar5 + 1;
          } while (ppIVar5 != ppIVar3);
        }
        if (local_48.
            super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (ppIVar2 == ppIVar3) {
          if (local_78 == (void *)0x0) {
            return __return_storage_ptr__;
          }
          operator_delete(local_78,(long)local_68 - (long)local_78);
          return __return_storage_ptr__;
        }
      }
      ppVVar6 = ppVVar6 + 1;
    } while (ppVVar6 != ppVVar1);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (undefined4)local_78;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
           _M_impl.super__Vector_impl_data._M_start + 4) = local_78._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iStack_70._M_current._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
           _M_impl.super__Vector_impl_data._M_finish + 4) = iStack_70._M_current._4_4_;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_68;
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::ICmpInst *>
RelationsAnalyzer::getEQICmp(const VRLocation &join) {
    std::vector<const llvm::ICmpInst *> result;
    for (const auto *loopEnd : join.loopEnds) {
        if (!loopEnd->op->isAssumeBool())
            continue;

        const auto *assume = static_cast<VRAssumeBool *>(loopEnd->op.get());
        const auto &icmps = structure.getRelevantConditions(assume);
        if (icmps.empty())
            return {};

        for (const auto *icmp : icmps) {
            Relation rel = ICMPToRel(icmp, assume->getAssumption());

            if (rel != Relations::EQ)
                continue; // TODO check or collect

            result.emplace_back(icmp);
        }
    }
    return result;
}